

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# quickhull.hpp
# Opt level: O0

void __thiscall
quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>::
make_facet<std::_List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>>>
          (quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>,double>
           *this,facet *_facet,
          _List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
          sbeg,size_type _vertex,bool _swap)

{
  size_type this_00;
  reference __x;
  reference __a;
  reference __b;
  reference __a_00;
  reference __b_00;
  value_type_conflict1 local_38;
  size_type v;
  size_type sStack_28;
  bool _swap_local;
  size_type _vertex_local;
  facet *_facet_local;
  quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
  *this_local;
  _List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
  sbeg_local;
  
  v._7_1_ = _swap;
  sStack_28 = _vertex;
  _vertex_local = (size_type)_facet;
  _facet_local = (facet *)this;
  this_local = (quick_hull<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_double>
                *)sbeg._M_node;
  std::
  vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
  ::reserve(&_facet->vertices_,*(size_type *)this);
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::reserve
            ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(_vertex_local + 0x18),
             *(size_type *)this);
  for (local_38 = 0; this_00 = _vertex_local, local_38 <= *(ulong *)this; local_38 = local_38 + 1) {
    if (local_38 != sStack_28) {
      __x = std::
            _List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
            ::operator*((_List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
                         *)&this_local);
      std::
      vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
      ::push_back((vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                   *)this_00,__x);
      std::vector<unsigned_long,_std::allocator<unsigned_long>_>::push_back
                ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)(_vertex_local + 0x18),
                 &local_38);
    }
    std::
    _List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
    ::operator++((_List_const_iterator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>
                  *)&this_local);
  }
  if ((bool)(v._7_1_ & 1) == ((*(long *)this - sStack_28 & 1) == 0)) {
    __a = std::
          vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
          ::front((vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                   *)_vertex_local);
    __b = std::
          vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
          ::back((vector<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>,_std::allocator<std::_Fwd_list_const_iterator<std::forward_list<double,_std::allocator<double>_>_>_>_>
                  *)_vertex_local);
    std::swap<std::_Fwd_list_const_iterator<std::forward_list<double,std::allocator<double>>>>
              (__a,__b);
    __a_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::front
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (_vertex_local + 0x18));
    __b_00 = std::vector<unsigned_long,_std::allocator<unsigned_long>_>::back
                       ((vector<unsigned_long,_std::allocator<unsigned_long>_> *)
                        (_vertex_local + 0x18));
    std::swap<unsigned_long>(__a_00,__b_00);
  }
  std::vector<double,_std::allocator<double>_>::resize
            ((vector<double,_std::allocator<double>_> *)(_vertex_local + 0x98),*(size_type *)this);
  return;
}

Assistant:

void
    make_facet(facet & _facet,
               iterator sbeg, // simplex
               size_type const _vertex,
               bool const _swap)
    {
        using iterator_traits = std::iterator_traits< iterator >;
        static_assert(std::is_base_of< std::input_iterator_tag, typename iterator_traits::iterator_category >::value);
        static_assert(std::is_constructible< point_iterator, typename iterator_traits::value_type >::value);
        _facet.vertices_.reserve(dimension_);
        _facet.neighbours_.reserve(dimension_);
        for (size_type v = 0; v <= dimension_; ++v) {
            if (v != _vertex) {
                _facet.vertices_.push_back(*sbeg);
                _facet.neighbours_.push_back(v);
            }
            ++sbeg;
        }
        if (_swap == (((dimension_ - _vertex) % 2) == 0)) {
            using std::swap;
            swap(_facet.vertices_.front(), _facet.vertices_.back());
            swap(_facet.neighbours_.front(), _facet.neighbours_.back());
        }
        _facet.normal_.resize(dimension_);
    }